

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eval_env.h
# Opt level: O0

void __thiscall Rule::Rule(Rule *this,string *name)

{
  string *name_local;
  Rule *this_local;
  
  std::__cxx11::string::string((string *)this,(string *)name);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_EvalString>_>_>
  ::map(&this->bindings_);
  return;
}

Assistant:

explicit Rule(const std::string& name) : name_(name) {}